

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O0

void __thiscall
Iir::Butterworth::BandShelfBase::setup
          (BandShelfBase *this,int order,double centerFrequency,double widthFrequency,double gainDb)

{
  long in_RDI;
  double in_XMM0_Qa;
  double unaff_retaddr;
  int in_stack_0000000c;
  AnalogLowShelf *in_stack_00000010;
  LayoutBase *in_stack_00000090;
  LayoutBase *in_stack_00000098;
  double in_stack_000000a0;
  double in_stack_000000a8;
  BandPassTransform *in_stack_000000b0;
  LayoutBase *in_stack_ffffffffffffffc8;
  Cascade *in_stack_ffffffffffffffd0;
  
  AnalogLowShelf::design(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  BandPassTransform::BandPassTransform
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000090);
  LayoutBase::setNormal
            ((LayoutBase *)(in_RDI + 0x10),
             (double)(-(ulong)(in_XMM0_Qa < 0.25) & 0x400921fb54442d18),1.0);
  Cascade::setLayout(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void BandShelfBase::setup (int order,
                           double centerFrequency,
                           double widthFrequency,
                           double gainDb)
{
  m_analogProto.design (order, gainDb);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  // HACK!
  m_digitalProto.setNormal ( (centerFrequency < 0.25) ? doublePi : 0, 1);

  Cascade::setLayout (m_digitalProto);
}